

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O0

int main(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  allocator<char> local_561;
  string local_560;
  allocator<char> local_539;
  string local_538;
  float local_518;
  allocator<char> local_511;
  float f;
  string str;
  char b;
  int a;
  allocator<char> local_4b9;
  string local_4b8 [39];
  allocator<char> local_491;
  string local_490 [39];
  allocator<char> local_469;
  string local_468 [39];
  allocator<char> local_441;
  string local_440 [32];
  CppLogger local_420 [8];
  CppLogger errorLogger;
  allocator<char> local_2a9;
  string local_2a8 [39];
  allocator<char> local_281;
  string local_280 [39];
  allocator<char> local_259;
  string local_258 [39];
  allocator<char> local_231;
  string local_230 [39];
  allocator<char> local_209;
  string local_208 [32];
  undefined4 local_1e8;
  undefined4 local_1e4;
  undefined4 local_1e0;
  undefined4 local_1dc;
  undefined4 *local_1d8;
  undefined8 local_1d0;
  Format local_1c8 [8];
  Format mainFormat;
  allocator<char> local_199;
  string local_198 [32];
  CppLogger local_178 [8];
  CppLogger mainLogger;
  
  CppLogger::CppLogger::CppLogger(local_178,Trace,"Main",false);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_198,"Test",&local_199);
  CppLogger::CppLogger::printTrace(local_178,local_198);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator(&local_199);
  local_1e8 = 2;
  local_1e4 = 1;
  local_1e0 = 3;
  local_1dc = 4;
  local_1d8 = &local_1e8;
  local_1d0 = 4;
  CppLogger::Format::Format(local_1c8,local_1d8,4);
  CppLogger::CppLogger::setFormat((Format *)local_178);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_208,"Main",&local_209);
  CppLogger::CppLogger::printTrace(local_178,local_208);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator(&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_230,"Main",&local_231);
  CppLogger::CppLogger::printInfo(local_178,local_230);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator(&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_258,"Main",&local_259);
  CppLogger::CppLogger::printWarn(local_178,local_258);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator(&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_280,"Main",&local_281);
  CppLogger::CppLogger::printError(local_178,local_280);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator(&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2a8,"Main",&local_2a9);
  CppLogger::CppLogger::printFatalError(local_178,local_2a8);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  CppLogger::CppLogger::CppLogger(local_420,Trace,"Error logger",false);
  CppLogger::CppLogger::setFormat((Format *)local_420);
  CppLogger::CppLogger::setOStream((ostream *)local_420);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_440,"Error",&local_441);
  CppLogger::CppLogger::printTrace(local_420,local_440);
  std::__cxx11::string::~string(local_440);
  std::allocator<char>::~allocator(&local_441);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_468,"Error",&local_469);
  CppLogger::CppLogger::printInfo(local_420,local_468);
  std::__cxx11::string::~string(local_468);
  std::allocator<char>::~allocator(&local_469);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_490,"Error",&local_491);
  CppLogger::CppLogger::printWarn(local_420,local_490);
  std::__cxx11::string::~string(local_490);
  std::allocator<char>::~allocator(&local_491);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4b8,"Error",&local_4b9);
  CppLogger::CppLogger::printError(local_420,local_4b8);
  std::__cxx11::string::~string(local_4b8);
  std::allocator<char>::~allocator(&local_4b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&a,"Error",(allocator<char> *)&b);
  CppLogger::CppLogger::printFatalError(local_420,&a);
  std::__cxx11::string::~string((string *)&a);
  std::allocator<char>::~allocator((allocator<char> *)&b);
  str.field_2._M_local_buf[0xf] = 'b';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&f,"I shall be logged",&local_511);
  std::allocator<char>::~allocator(&local_511);
  local_518 = 5.4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_538,"Printing a:{}, and b: {}, but not f;",&local_539);
  CppLogger::CppLogger::printTrace<int,char,float>
            (local_420,&local_538,5,str.field_2._M_local_buf[0xf],local_518);
  std::__cxx11::string::~string((string *)&local_538);
  std::allocator<char>::~allocator(&local_539);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_560,"{}",&local_561);
  std::__cxx11::string::string
            ((string *)&local_588,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f);
  CppLogger::CppLogger::printWarn<std::__cxx11::string>(local_420,&local_560,&local_588);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_560);
  std::allocator<char>::~allocator(&local_561);
  std::__cxx11::string::~string((string *)&f);
  CppLogger::CppLogger::~CppLogger(local_420);
  CppLogger::Format::~Format(local_1c8);
  CppLogger::CppLogger::~CppLogger(local_178);
  return 0;
}

Assistant:

int main() {
    // Creating a logger (the last parameter is false by default and 
    //  if is set to true it will exit after a printFatalError())
    CppLogger::CppLogger mainLogger(CppLogger::Level::Trace, "Main"/*, true*/);

    // Trace level log
    mainLogger.printTrace("Test");

    // Create a format for your logger (the order of the format is respected)
    CppLogger::Format mainFormat({
            CppLogger::FormatAttribute::Time,
            CppLogger::FormatAttribute::Name,
            CppLogger::FormatAttribute::Level,
            CppLogger::FormatAttribute::Message
            });

    // Apply the format to your logger
    mainLogger.setFormat(mainFormat);

    // Different levels of logging
    mainLogger.printTrace("Main");
    mainLogger.printInfo("Main");
    mainLogger.printWarn("Main");
    mainLogger.printError("Main");
    mainLogger.printFatalError("Main");

    CppLogger::CppLogger errorLogger(CppLogger::Level::Trace, "Error logger");

    errorLogger.setFormat(mainFormat);

    errorLogger.setOStream(std::cerr);

    errorLogger.printTrace("Error");
    errorLogger.printInfo("Error");
    errorLogger.printWarn("Error");
    errorLogger.printError("Error");
    errorLogger.printFatalError("Error");

    int a = 5;
    char b = 'b';
    std::string str = "I shall be logged";
    float f = 5.4f;

    errorLogger.printTrace("Printing a:{}, and b: {}, but not f;", a, b, f);
    errorLogger.printWarn("{}", str);
}